

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.hpp
# Opt level: O0

bool __thiscall
OpenMD::MoleculeStamp::
addIndexSensitiveStamp<std::vector<OpenMD::AtomStamp*,std::allocator<OpenMD::AtomStamp*>>,OpenMD::AtomStamp>
          (MoleculeStamp *this,
          vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_> *cont,AtomStamp *stamp)

{
  uint uVar1;
  const_iterator __position;
  reference ppAVar2;
  iterator __n;
  AtomStamp *in_RDX;
  vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_> *in_RSI;
  size_t size;
  bool ret;
  uint index;
  vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_> *in_stack_ffffffffffffff98;
  vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_> *this_00;
  vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_> *in_stack_ffffffffffffffd0;
  undefined1 local_1d;
  
  uVar1 = AtomStamp::getIndex(in_RDX);
  __position._M_current =
       (AtomStamp **)
       std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::size(in_RSI);
  if (__position._M_current < (AtomStamp **)(ulong)(uVar1 + 1)) {
    this_00 = in_RSI;
    __n = std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::end
                    (in_stack_ffffffffffffff98);
    __gnu_cxx::
    __normal_iterator<OpenMD::AtomStamp*const*,std::vector<OpenMD::AtomStamp*,std::allocator<OpenMD::AtomStamp*>>>
    ::__normal_iterator<OpenMD::AtomStamp**>
              ((__normal_iterator<OpenMD::AtomStamp_*const_*,_std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>_>
                *)this_00,
               (__normal_iterator<OpenMD::AtomStamp_**,_std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>_>
                *)in_stack_ffffffffffffff98);
    std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::size(in_RSI);
    std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::insert
              (in_stack_ffffffffffffffd0,__position,(size_type)__n._M_current,(value_type *)0x0);
    ppAVar2 = std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::operator[]
                        (in_RSI,(ulong)uVar1);
    *ppAVar2 = in_RDX;
    local_1d = true;
  }
  else {
    ppAVar2 = std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::operator[]
                        (in_RSI,(ulong)uVar1);
    local_1d = *ppAVar2 == (value_type)0x0;
    if (local_1d) {
      ppAVar2 = std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::operator[]
                          (in_RSI,(ulong)uVar1);
      *ppAVar2 = in_RDX;
    }
  }
  return local_1d;
}

Assistant:

bool addIndexSensitiveStamp(Cont& cont, T* stamp) {
      // typename Cont::iterator i;
      unsigned int index = stamp->getIndex();
      bool ret           = false;
      size_t size        = cont.size();

      if (size >= index + 1) {
        if (cont[index] != NULL) {
          ret = false;
        } else {
          cont[index] = stamp;
          ret         = true;
        }
      } else {
        cont.insert(cont.end(), index - cont.size() + 1, NULL);
        cont[index] = stamp;
        ret         = true;
      }

      return ret;
    }